

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  lua_CFunction p_Var1;
  Value *pVVar2;
  int iVar3;
  TValue *pTVar4;
  TValue *io1;
  TValue *io2;
  TValue *gt;
  Table *reg;
  LClosure *f;
  undefined1 local_58 [4];
  int status;
  ZIO z;
  char *mode_local;
  char *chunkname_local;
  void *data_local;
  lua_Reader reader_local;
  lua_State *L_local;
  
  mode_local = chunkname;
  if (chunkname == (char *)0x0) {
    mode_local = "?";
  }
  z.L = (lua_State *)mode;
  luaZ_init(L,(ZIO *)local_58,reader,data);
  iVar3 = luaD_protectedparser(L,(ZIO *)local_58,mode_local,(char *)z.L);
  if ((iVar3 == 0) && (p_Var1 = L->top[-1].value_.f, p_Var1[10] == (_func_int_lua_State_ptr)0x1)) {
    pTVar4 = luaH_getint(&((L->l_G->l_registry).value_.gc)->h,2);
    pVVar2 = *(Value **)(*(long *)(p_Var1 + 0x20) + 0x10);
    *pVVar2 = pTVar4->value_;
    pVVar2[1].b = pTVar4->tt_;
    if (((pTVar4->tt_ & 0x40U) != 0) &&
       ((((byte)(pTVar4->value_).f[9] & 3) != 0 &&
        ((*(byte *)(*(long *)(p_Var1 + 0x20) + 9) & 4) != 0)))) {
      luaC_barrier_(L,*(GCObject **)(p_Var1 + 0x20),(pTVar4->value_).gc);
    }
  }
  return iVar3;
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    LClosure *f = clLvalue(L->top - 1);  /* get newly created function */
    if (f->nupvalues == 1) {  /* does it have one upvalue? */
      /* get global table from registry */
      Table *reg = hvalue(&G(L)->l_registry);
      const TValue *gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
      /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
      setobj(L, f->upvals[0]->v, gt);
      luaC_barrier(L, f->upvals[0], gt);
    }
  }
  lua_unlock(L);
  return status;
}